

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O1

bool __thiscall
QNativeSocketEnginePrivate::createNewSocket
          (QNativeSocketEnginePrivate *this,SocketType socketType,
          NetworkLayerProtocol *socketProtocol)

{
  uint uVar1;
  int *piVar2;
  ErrorString errorString;
  SocketError error;
  int newtype;
  int iVar3;
  
  if (socketType != SctpSocket) {
    iVar3 = (socketType == UdpSocket) + 0x80801;
    uVar1 = ::socket((uint)((uint)(*socketProtocol + UnknownNetworkLayerProtocol) < 2) * 8 + 2,iVar3
                     ,0);
    if ((((int)uVar1 < 0) && (*socketProtocol == AnyIPProtocol)) &&
       (piVar2 = __errno_location(), *piVar2 == 0x61)) {
      uVar1 = ::socket(2,iVar3,0);
      *socketProtocol = IPv4Protocol;
    }
    if (-1 < (int)uVar1) {
      this->socketDescriptor = (ulong)uVar1;
      (this->super_QAbstractSocketEnginePrivate).socketProtocol = *socketProtocol;
      (this->super_QAbstractSocketEnginePrivate).socketType = socketType;
      return true;
    }
    piVar2 = __errno_location();
    iVar3 = *piVar2;
    if (iVar3 < 0x17) {
      if (iVar3 == 0xc) goto LAB_002329d4;
      if (iVar3 == 0xd) {
        error = SocketAccessError;
        errorString = AccessErrorString;
        goto LAB_002328f1;
      }
      if (iVar3 != 0x16) {
        return false;
      }
    }
    else if (iVar3 < 0x61) {
      if (iVar3 - 0x17U < 2) {
LAB_002329d4:
        error = SocketResourceError;
        errorString = ResourceErrorString;
        goto LAB_002328f1;
      }
      if (iVar3 != 0x5d) {
        return false;
      }
    }
    else {
      if (iVar3 == 0x69) goto LAB_002329d4;
      if (iVar3 != 0x61) {
        return false;
      }
    }
  }
  error = UnsupportedSocketOperationError;
  errorString = ProtocolUnsupportedErrorString;
LAB_002328f1:
  setError(this,error,errorString);
  return false;
}

Assistant:

bool QNativeSocketEnginePrivate::createNewSocket(QAbstractSocket::SocketType socketType,
                                         QAbstractSocket::NetworkLayerProtocol &socketProtocol)
{
#ifndef QT_NO_SCTP
    int protocol = (socketType == QAbstractSocket::SctpSocket) ? IPPROTO_SCTP : 0;
#else
    if (socketType == QAbstractSocket::SctpSocket) {
        setError(QAbstractSocket::UnsupportedSocketOperationError,
                 ProtocolUnsupportedErrorString);
#if defined (QNATIVESOCKETENGINE_DEBUG)
        qDebug("QNativeSocketEnginePrivate::createNewSocket(%d, %d): unsupported protocol",
               socketType, socketProtocol);
#endif
        return false;
    }
    int protocol = 0;
#endif // QT_NO_SCTP
    int domain = (socketProtocol == QAbstractSocket::IPv6Protocol
                  || socketProtocol == QAbstractSocket::AnyIPProtocol) ? AF_INET6 : AF_INET;
    int type = (socketType == QAbstractSocket::UdpSocket) ? SOCK_DGRAM : SOCK_STREAM;

    int socket = qt_safe_socket(domain, type, protocol, O_NONBLOCK);
    if (socket < 0 && socketProtocol == QAbstractSocket::AnyIPProtocol && errno == EAFNOSUPPORT) {
        domain = AF_INET;
        socket = qt_safe_socket(domain, type, protocol, O_NONBLOCK);
        socketProtocol = QAbstractSocket::IPv4Protocol;
    }

    if (socket < 0) {
        int ecopy = errno;
        switch (ecopy) {
        case EPROTONOSUPPORT:
        case EAFNOSUPPORT:
        case EINVAL:
            setError(QAbstractSocket::UnsupportedSocketOperationError, ProtocolUnsupportedErrorString);
            break;
        case ENFILE:
        case EMFILE:
        case ENOBUFS:
        case ENOMEM:
            setError(QAbstractSocket::SocketResourceError, ResourceErrorString);
            break;
        case EACCES:
            setError(QAbstractSocket::SocketAccessError, AccessErrorString);
            break;
        default:
            break;
        }

#if defined (QNATIVESOCKETENGINE_DEBUG)
        qDebug("QNativeSocketEnginePrivate::createNewSocket(%d, %d) == false (%s)",
               socketType, socketProtocol,
               strerror(ecopy));
#endif

        return false;
    }

#if defined (QNATIVESOCKETENGINE_DEBUG)
    qDebug("QNativeSocketEnginePrivate::createNewSocket(%d, %d) == true",
           socketType, socketProtocol);
#endif

    socketDescriptor = socket;
    this->socketProtocol = socketProtocol;
    this->socketType = socketType;
    return true;
}